

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O2

vector<sha256_hash> * __thiscall
libtorrent::aux::merkle_tree::get_piece_layer
          (vector<sha256_hash> *__return_storage_ptr__,merkle_tree *this)

{
  mode_t mVar1;
  pointer pdVar2;
  pointer pdVar3;
  sha256_hash pad;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  span<const_libtorrent::digest32<256L>_> leaves;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> scratch_space;
  digest32<256L> local_70;
  sha256_hash local_50;
  
  (__return_storage_ptr__->
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mVar1 = this->m_mode;
  if (mVar1 == block_layer) {
    container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
    ::reserve<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                         *)__return_storage_ptr__,
                        this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
                        (this->m_blocks_per_piece_log & 0x1f));
    scratch_space.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scratch_space.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scratch_space.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar4 = 1 << (this->m_blocks_per_piece_log & 0x1f);
    lVar6 = (long)iVar4;
    lVar8 = 0;
    lVar7 = 0;
    lVar9 = 0;
    while( true ) {
      pdVar2 = (this->m_tree).
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(this->m_tree).
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
      if ((int)(uVar10 >> 5) <= lVar9) break;
      digest32<256L>::clear(&local_70);
      pad.m_number._M_elems[2] = local_70.m_number._M_elems[2];
      pad.m_number._M_elems[3] = local_70.m_number._M_elems[3];
      pad.m_number._M_elems[0] = local_70.m_number._M_elems[0];
      pad.m_number._M_elems[1] = local_70.m_number._M_elems[1];
      pad.m_number._M_elems[4] = local_70.m_number._M_elems[4];
      pad.m_number._M_elems[5] = local_70.m_number._M_elems[5];
      pad.m_number._M_elems[6] = local_70.m_number._M_elems[6];
      pad.m_number._M_elems[7] = local_70.m_number._M_elems[7];
      leaves.m_len = ((long)uVar10 >> 5) + lVar8;
      leaves.m_ptr = (digest32<256L> *)((long)(pdVar2->m_number)._M_elems + lVar7);
      merkle_root_scratch(&local_50,leaves,iVar4,pad,&scratch_space);
      ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
      emplace_back<libtorrent::digest32<256l>>
                ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
                 __return_storage_ptr__,&local_50);
      lVar9 = lVar9 + lVar6;
      lVar7 = lVar7 + lVar6 * 0x20;
      lVar8 = lVar8 - lVar6;
    }
    ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
    ~_Vector_base(&scratch_space.
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 );
  }
  else if (mVar1 == piece_layer) {
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
    operator=(&__return_storage_ptr__->
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              ,&(this->m_tree).
                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             );
  }
  else if (mVar1 == full_tree) {
    pdVar2 = (this->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = piece_layer_start(this);
    pdVar3 = (this->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = piece_layer_start(this);
    ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>const*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
              ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
               __return_storage_ptr__,pdVar2 + iVar4,
               pdVar3 + (long)iVar5 +
                        (long)((1 << (this->m_blocks_per_piece_log & 0x1f)) + this->m_num_blocks +
                               -1 >> (this->m_blocks_per_piece_log & 0x1f)));
  }
  return __return_storage_ptr__;
}

Assistant:

aux::vector<sha256_hash> merkle_tree::get_piece_layer() const
	{
		aux::vector<sha256_hash> ret;

		switch (m_mode)
		{
			case mode_t::uninitialized_tree: break;
			case mode_t::empty_tree: break;
			case mode_t::full_tree:
				ret.assign(m_tree.begin() + piece_layer_start()
					, m_tree.begin() + piece_layer_start() + num_pieces());
				break;
			case mode_t::piece_layer:
			{
				ret = m_tree;
				break;
			}
			case mode_t::block_layer:
			{
				ret.reserve(num_pieces());
				std::vector<sha256_hash> scratch_space;

				int const blocks_in_piece = blocks_per_piece();
				for (int b = 0; b < int(m_tree.size()); b += blocks_in_piece)
				{
					auto const leafs = span<sha256_hash const>(m_tree).subspan(b);
					ret.push_back(merkle_root_scratch(leafs, blocks_in_piece, sha256_hash{}, scratch_space));
				}
				break;
			}
		}
		return ret;
	}